

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int_mv av1_compute_mv_difference
                 (TplDepFrame *tpl_frame,int row,int col,int step,int tpl_stride,int right_shift)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  TplDepStats *pTVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  ushort uVar17;
  
  bVar5 = (byte)right_shift;
  pTVar4 = tpl_frame->tpl_stats_ptr;
  iVar9 = (row >> (bVar5 & 0x1f)) * tpl_stride;
  iVar15 = col >> (bVar5 & 0x1f);
  iVar1 = iVar9 + iVar15;
  uVar8 = (ulong)pTVar4[iVar1].ref_frame_index[0];
  uVar2 = pTVar4[iVar1].mv[uVar8].as_mv.row;
  uVar3 = *(ushort *)((long)pTVar4[iVar1].mv + uVar8 * 4 + 2);
  uVar17 = -uVar2;
  if (0 < (short)uVar2) {
    uVar17 = uVar2;
  }
  uVar14 = -uVar3;
  if (0 < (short)uVar3) {
    uVar14 = uVar3;
  }
  uVar12 = row - step;
  uVar10 = 0x7fffffff;
  if ((int)uVar12 < 0) {
    uVar16 = 0x7fffffff;
  }
  else {
    iVar15 = (uVar12 >> (bVar5 & 0x1f)) * tpl_stride + iVar15;
    uVar13 = uVar2 - pTVar4[iVar15].mv[pTVar4[iVar15].ref_frame_index[0]].as_mv.row;
    tpl_stride = (int)uVar13;
    uVar11 = uVar3 - *(short *)((long)pTVar4[iVar15].mv +
                               (long)pTVar4[iVar15].ref_frame_index[0] * 4 + 2);
    uVar12 = (uint)uVar11;
    uVar6 = -uVar13;
    if (0 < (short)uVar13) {
      uVar6 = uVar13;
    }
    uVar8 = (ulong)uVar6;
    uVar13 = -uVar11;
    if (0 < (short)uVar11) {
      uVar13 = uVar11;
    }
    uVar16 = (uint)uVar13 + (uint)uVar6;
  }
  uVar7 = (uint)uVar8;
  if (-1 < col - step) {
    iVar9 = iVar9 + ((uint)(col - step) >> (bVar5 & 0x1f));
    uVar13 = uVar2 - pTVar4[iVar9].mv[pTVar4[iVar9].ref_frame_index[0]].as_mv.row;
    uVar7 = (uint)uVar13;
    uVar11 = uVar3 - *(short *)((long)pTVar4[iVar9].mv +
                               (long)pTVar4[iVar9].ref_frame_index[0] * 4 + 2);
    step = (int)uVar11;
    uVar6 = -uVar13;
    if (0 < (short)uVar13) {
      uVar6 = uVar13;
    }
    uVar13 = -uVar11;
    if (0 < (short)uVar11) {
      uVar13 = uVar11;
    }
    uVar10 = (uint)uVar13 + (uint)uVar6;
  }
  if (((uVar10 <= uVar16) || ((uint)uVar14 + (uint)uVar17 <= uVar16)) &&
     (uVar12 = (uint)uVar3, tpl_stride = (uint)uVar2,
     uVar10 < uVar16 && uVar10 < (uint)uVar14 + (uint)uVar17)) {
    uVar12 = step;
    tpl_stride = uVar7;
  }
  return (int_mv)(tpl_stride & 0xffffU | uVar12 << 0x10);
}

Assistant:

int_mv av1_compute_mv_difference(const TplDepFrame *tpl_frame, int row, int col,
                                 int step, int tpl_stride, int right_shift) {
  const TplDepStats *tpl_stats =
      &tpl_frame
           ->tpl_stats_ptr[av1_tpl_ptr_pos(row, col, tpl_stride, right_shift)];
  int_mv current_mv = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
  int current_mv_magnitude =
      abs(current_mv.as_mv.row) + abs(current_mv.as_mv.col);

  // Retrieve the up and left neighbors.
  int up_error = INT_MAX;
  int_mv up_mv_diff;
  if (row - step >= 0) {
    tpl_stats = &tpl_frame->tpl_stats_ptr[av1_tpl_ptr_pos(
        row - step, col, tpl_stride, right_shift)];
    up_mv_diff = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
    up_mv_diff.as_mv.row = current_mv.as_mv.row - up_mv_diff.as_mv.row;
    up_mv_diff.as_mv.col = current_mv.as_mv.col - up_mv_diff.as_mv.col;
    up_error = abs(up_mv_diff.as_mv.row) + abs(up_mv_diff.as_mv.col);
  }

  int left_error = INT_MAX;
  int_mv left_mv_diff;
  if (col - step >= 0) {
    tpl_stats = &tpl_frame->tpl_stats_ptr[av1_tpl_ptr_pos(
        row, col - step, tpl_stride, right_shift)];
    left_mv_diff = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
    left_mv_diff.as_mv.row = current_mv.as_mv.row - left_mv_diff.as_mv.row;
    left_mv_diff.as_mv.col = current_mv.as_mv.col - left_mv_diff.as_mv.col;
    left_error = abs(left_mv_diff.as_mv.row) + abs(left_mv_diff.as_mv.col);
  }

  // Return the MV with the minimum distance from current.
  if (up_error < left_error && up_error < current_mv_magnitude) {
    return up_mv_diff;
  } else if (left_error < up_error && left_error < current_mv_magnitude) {
    return left_mv_diff;
  }
  return current_mv;
}